

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

HRESULT __thiscall
Js::ScriptContext::OnDebuggerAttachedDetached
          (ScriptContext *this,bool attach,NativeCodeGenerator **previousCodeGenHolder)

{
  int iVar1;
  ThreadContext *this_00;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  Utf8SourceInfo *this_01;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_> *pSVar4;
  FunctionBody *pFVar5;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_02;
  code *pcVar6;
  bool inDebugMode;
  bool bVar7;
  HRESULT HVar8;
  DebugContext *pDVar9;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar10;
  undefined4 *puVar11;
  long lVar12;
  int iVar13;
  undefined7 in_register_00000031;
  ulong uVar14;
  AutoNestedHandledExceptionType local_38;
  undefined4 local_34;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  this_00 = this->threadContext;
  this_00->debugManager->isDebuggerAttaching = true;
  ThreadContext::InvalidateAllProtoInlineCaches(this_00);
  ThreadContext::InvalidateAllStoreFieldInlineCaches(this->threadContext);
  ThreadContext::InvalidateAllIsInstInlineCaches(this->threadContext);
  if (attach) {
    if (DAT_0143bfa7 == '\0') {
LAB_006f12c1:
      HVar8 = RecreateNativeCodeGenerator(this,previousCodeGenHolder);
      if (HVar8 < 0) goto LAB_006f14ff;
      if (attach) {
        pDVar9 = GetDebugContext(this);
        DebugContext::SetDebuggerMode(pDVar9,Debugging);
        UpdateNativeCodeGeneratorForDebugMode(this->nativeCodeGen);
      }
    }
    else {
      pDVar9 = GetDebugContext(this);
      DebugContext::SetDebuggerMode(pDVar9,Debugging);
    }
  }
  else {
    UnRegisterDebugThunk(this);
    pDVar9 = GetDebugContext(this);
    ProbeContainer::RemoveAllProbes(pDVar9->diagProbesContainer);
    if (DAT_0143bfa7 == '\0') goto LAB_006f12c1;
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_38,ExceptionType_OutOfMemory);
  local_34 = (undefined4)CONCAT71(in_register_00000031,attach);
  pLVar10 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->sourceList);
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  inDebugMode = SUB41(local_34,0);
  for (lVar12 = 0;
      lVar12 < (pLVar10->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).count; lVar12 = lVar12 + 1) {
    pRVar2 = (pLVar10->
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
             ).buffer.ptr[lVar12].ptr;
    if ((((ulong)pRVar2 & 1) == 0 && pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
       (this_01 = (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef,
       this_01 != (Utf8SourceInfo *)0x0)) {
      if ((this_01->field_0xa8 & 4) == 0) {
        Utf8SourceInfo::SetInDebugMode(this_01,inDebugMode);
        pSVar3 = (this_01->functionBodyDictionary).ptr;
        if (pSVar3 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                       *)0x0) {
          for (uVar14 = 0;
              uVar14 < (pSVar3->
                       super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).bucketCount; uVar14 = uVar14 + 1) {
            iVar13 = (pSVar3->
                     super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ).buckets.ptr[uVar14];
            if (iVar13 != -1) {
              while (iVar13 != -1) {
                pSVar4 = (pSVar3->
                         super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).entries.ptr;
                iVar1 = pSVar4[iVar13].
                        super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .
                        super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                        .
                        super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .next;
                pFVar5 = pSVar4[iVar13].
                         super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .
                         super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .
                         super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                         .
                         super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .value.ptr;
                if (pFVar5 == (FunctionBody *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                              ,0xa2,"(functionBody)","functionBody");
                  if (!bVar7) {
LAB_006f1522:
                    pcVar6 = (code *)invalidInstructionException();
                    (*pcVar6)();
                  }
                  *puVar11 = 0;
                }
                FunctionBody::SetEntryToDeferParseForDebugger(pFVar5);
                iVar13 = iVar1;
              }
            }
          }
        }
      }
      else {
        pSVar3 = (this_01->functionBodyDictionary).ptr;
        if (pSVar3 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                       *)0x0) {
          for (uVar14 = 0;
              uVar14 < (pSVar3->
                       super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).bucketCount; uVar14 = uVar14 + 1) {
            iVar13 = (pSVar3->
                     super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ).buckets.ptr[uVar14];
            if (iVar13 != -1) {
              while (iVar13 != -1) {
                pSVar4 = (pSVar3->
                         super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).entries.ptr;
                iVar1 = pSVar4[iVar13].
                        super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .
                        super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                        .
                        super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .next;
                pFVar5 = pSVar4[iVar13].
                         super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .
                         super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .
                         super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                         .
                         super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .value.ptr;
                if (pFVar5 == (FunctionBody *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                              ,0xa2,"(functionBody)","functionBody");
                  if (!bVar7) goto LAB_006f1522;
                  *puVar11 = 0;
                }
                FunctionBody::ResetEntryPoint(pFVar5);
                iVar13 = iVar1;
              }
            }
          }
        }
      }
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_38);
  if ((char)local_34 != '\0') {
    RegisterDebugThunk(this,true);
  }
  this_02 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
  HVar8 = 0;
  if (this_02 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
    SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Reset(this_02);
  }
LAB_006f14ff:
  this_00->debugManager->isDebuggerAttaching = false;
  return HVar8;
}

Assistant:

HRESULT ScriptContext::OnDebuggerAttachedDetached(bool attach)
#endif
    {

        // notify threadContext that debugger is attaching so do not do expire
        struct AutoRestore
        {
            AutoRestore(ThreadContext* threadContext)
                :threadContext(threadContext)
            {
                this->threadContext->GetDebugManager()->SetDebuggerAttaching(true);
            }
            ~AutoRestore()
            {
                this->threadContext->GetDebugManager()->SetDebuggerAttaching(false);
            }

        private:
            ThreadContext* threadContext;

        } autoRestore(this->GetThreadContext());

        // Invalidate all the caches.
        this->threadContext->InvalidateAllProtoInlineCaches();
        this->threadContext->InvalidateAllStoreFieldInlineCaches();
        this->threadContext->InvalidateAllIsInstInlineCaches();

        if (!attach)
        {
            this->UnRegisterDebugThunk();

            // Remove all breakpoint probes
            this->GetDebugContext()->GetProbeContainer()->RemoveAllProbes();
        }

        HRESULT hr = S_OK;

        if (!CONFIG_FLAG(ForceDiagnosticsMode))
        {
#if ENABLE_NATIVE_CODEGEN
            // Recreate the native code generator so that all pending
            // JIT work items will be cleared.
            hr = RecreateNativeCodeGenerator(previousCodeGenHolder);
            if (FAILED(hr))
            {
                return hr;
            }
#endif
            if (attach)
            {
                // We need to transition to debug mode after the NativeCodeGenerator is cleared/closed. Since the NativeCodeGenerator will be working on a different thread - it may
                // be checking on the DebuggerState (from ScriptContext) while emitting code.
                this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
#if ENABLE_NATIVE_CODEGEN
                UpdateNativeCodeGeneratorForDebugMode(this->nativeCodeGen);
#endif
            }
        }
        else if (attach)
        {
            this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
        }

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        {
            // Remap all the function entry point thunks.
            this->sourceList->Map([=](uint i, RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef) {
                Js::Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();

                if (sourceInfo != nullptr)
                {
                    if (!sourceInfo->GetIsLibraryCode())
                    {
                        sourceInfo->SetInDebugMode(attach);

                        sourceInfo->MapFunction([](Js::FunctionBody* functionBody) {
                            functionBody->SetEntryToDeferParseForDebugger();
                        });
                    }
                    else
                    {
                        sourceInfo->MapFunction([](Js::FunctionBody* functionBody) {
                            functionBody->ResetEntryPoint();
                        });
                    }
                }
            });
        }